

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FragmentStamp.cpp
# Opt level: O2

void __thiscall OpenMD::FragmentStamp::validate(FragmentStamp *this)

{
  pointer pcVar1;
  pointer piVar2;
  pointer ppRVar3;
  pointer piVar4;
  int iVar5;
  uint uVar6;
  size_t i;
  ulong uVar7;
  vector<int,_std::allocator<int>_> members;
  string local_40 [8];
  long local_38;
  
  DataHolder::validate(&this->super_DataHolder);
  if ((this->Name).super_ParameterBase.empty_ == false) {
    isNotEmpty();
    std::__cxx11::string::string(local_40,(string *)&(this->Name).data_);
    std::__cxx11::string::~string(local_40);
    std::__cxx11::string::~string((string *)&members);
    if (local_38 == 0) {
      pcVar1 = (this->Name).super_ParameterBase.keyword_._M_dataplus._M_p;
      isNotEmpty();
      std::__cxx11::string::string((string *)&members,local_40);
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",pcVar1,
               members.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
               ._M_start);
      std::__cxx11::string::~string((string *)&members);
      std::__cxx11::string::~string(local_40);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  std::vector<int,_std::allocator<int>_>::resize
            (&this->atom2Rigidbody,
             (long)(this->atomStamps_).
                   super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(this->atomStamps_).
                   super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 3);
  piVar2 = (this->atom2Rigidbody).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar4 = (this->atom2Rigidbody).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  iVar5 = -1;
  for (uVar6 = 0; (ulong)uVar6 < (ulong)((long)piVar4 - (long)piVar2 >> 2); uVar6 = uVar6 + 1) {
    piVar2[uVar6] = iVar5;
    iVar5 = iVar5 + -1;
  }
  for (uVar7 = 0;
      ppRVar3 = (this->rigidBodyStamps_).
                super__Vector_base<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>
                ._M_impl.super__Vector_impl_data._M_start,
      uVar7 < (ulong)((long)(this->rigidBodyStamps_).
                            super__Vector_base<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppRVar3 >> 3);
      uVar7 = uVar7 + 1) {
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)
               &members.super__Vector_base<int,_std::allocator<int>_>,&ppRVar3[(int)uVar7]->members_
              );
    piVar2 = (this->atom2Rigidbody).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (piVar4 = members.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        piVar4 != members.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish; piVar4 = piVar4 + 1) {
      piVar2[*piVar4] = (int)uVar7;
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&members.super__Vector_base<int,_std::allocator<int>_>);
  }
  checkAtoms(this);
  checkBonds(this);
  fillBondInfo(this);
  checkBends(this);
  checkTorsions(this);
  checkInversions(this);
  checkRigidBodies(this);
  checkCutoffGroups(this);
  checkConstraints(this);
  checkNodes(this);
  return;
}

Assistant:

void FragmentStamp::validate() {
    DataHolder::validate();
    CheckParameter(Name, isNotEmpty());

    atom2Rigidbody.resize(getNAtoms());

    // A negative number means the atom is a free atom, and does not
    // belong to rigidbody. Every element in atom2Rigidbody has unique
    // negative number at the very beginning

    for (unsigned int i = 0; i < atom2Rigidbody.size(); ++i) {
      atom2Rigidbody[i] = -1 - int(i);
    }
    for (std::size_t i = 0; i < getNRigidBodies(); ++i) {
      RigidBodyStamp* rbStamp  = getRigidBodyStamp(i);
      std::vector<int> members = rbStamp->getMembers();
      for (std::vector<int>::iterator j = members.begin(); j != members.end();
           ++j) {
        atom2Rigidbody[*j] = i;
      }
    }
    checkAtoms();
    checkBonds();
    fillBondInfo();
    checkBends();
    checkTorsions();
    checkInversions();
    checkRigidBodies();
    checkCutoffGroups();
    checkConstraints();
    checkNodes();
  }